

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.h
# Opt level: O0

void __thiscall SampleMuxerMetadata::SortableCue::~SortableCue(SortableCue *this)

{
  SortableCue *this_local;
  
  libwebvtt::Cue::~Cue(&this->cue);
  return;
}

Assistant:

bool operator>(int64_t time_ns) const {
      // Cue start time expressed in milliseconds
      const int64_t start_ms = cue.start_time.presentation();

      // Cue start time expressed in nanoseconds (MKV time)
      const int64_t start_ns = start_ms * 1000000;

      return (start_ns > time_ns);
    }